

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void yy_shift(yyParser *yypParser,int yyNewState,int yyMajor,YYMINORTYPE *yypMinor)

{
  YYMINORTYPE *pYVar1;
  int iVar2;
  Parse *pParse;
  Expr *pEVar3;
  ulong uVar4;
  
  iVar2 = yypParser->yyidx;
  uVar4 = (ulong)iVar2;
  yypParser->yyidx = iVar2 + 1;
  if ((long)uVar4 < 99) {
    yypParser->yystack[uVar4 + 1].stateno = (unsigned_short)yyNewState;
    yypParser->yystack[uVar4 + 1].major = (uchar)yyMajor;
    pEVar3 = (yypMinor->yy64).pOffset;
    pYVar1 = &yypParser->yystack[uVar4 + 1].minor;
    (pYVar1->yy0).z = (yypMinor->yy0).z;
    (&pYVar1->yy122)[1] = pEVar3;
    yypParser->yystack[uVar4 + 1].minor.yy342.zEnd = (yypMinor->yy342).zEnd;
  }
  else {
    pParse = yypParser->pParse;
    yypParser->yyidx = iVar2;
    while (-1 < (int)uVar4) {
      yy_pop_parser_stack(yypParser);
      uVar4 = (ulong)(uint)yypParser->yyidx;
    }
    sqlite3ErrorMsg(pParse,"parser stack overflow");
    yypParser->pParse = pParse;
  }
  return;
}

Assistant:

static void yy_shift(
  yyParser *yypParser,          /* The parser to be shifted */
  int yyNewState,               /* The new state to shift in */
  int yyMajor,                  /* The major token to shift in */
  YYMINORTYPE *yypMinor         /* Pointer to the minor token to shift in */
){
  yyStackEntry *yytos;
  yypParser->yyidx++;
#ifdef YYTRACKMAXSTACKDEPTH
  if( yypParser->yyidx>yypParser->yyidxMax ){
    yypParser->yyidxMax = yypParser->yyidx;
  }
#endif
#if YYSTACKDEPTH>0 
  if( yypParser->yyidx>=YYSTACKDEPTH ){
    yyStackOverflow(yypParser, yypMinor);
    return;
  }
#else
  if( yypParser->yyidx>=yypParser->yystksz ){
    yyGrowStack(yypParser);
    if( yypParser->yyidx>=yypParser->yystksz ){
      yyStackOverflow(yypParser, yypMinor);
      return;
    }
  }
#endif
  yytos = &yypParser->yystack[yypParser->yyidx];
  yytos->stateno = (YYACTIONTYPE)yyNewState;
  yytos->major = (YYCODETYPE)yyMajor;
  yytos->minor = *yypMinor;
#ifndef NDEBUG
  if( yyTraceFILE && yypParser->yyidx>0 ){
    int i;
    fprintf(yyTraceFILE,"%sShift %d\n",yyTracePrompt,yyNewState);
    fprintf(yyTraceFILE,"%sStack:",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE," %s",yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"\n");
  }
#endif
}